

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O0

void o3dgc::SphereToCube<long>(long x,long y,long z,long *a,long *b,char *index)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long az;
  long ay;
  long ax;
  char *index_local;
  long *b_local;
  long *a_local;
  long z_local;
  long y_local;
  long x_local;
  
  a_local = (long *)z;
  z_local = y;
  y_local = x;
  lVar1 = absolute<long>(&y_local);
  lVar2 = absolute<long>(&z_local);
  lVar3 = absolute<long>((long *)&a_local);
  if ((lVar3 < lVar1) || (lVar3 < lVar2)) {
    if ((lVar2 < lVar1) || (lVar2 < lVar3)) {
      if ((lVar2 <= lVar1) && (lVar3 <= lVar1)) {
        if (y_local < 0) {
          *index = '\x05';
          *a = -z_local;
          *b = -(long)a_local;
        }
        else {
          *index = '\x04';
          *a = z_local;
          *b = (long)a_local;
        }
      }
    }
    else if (z_local < 0) {
      *index = '\x03';
      *a = -(long)a_local;
      *b = -y_local;
    }
    else {
      *index = '\x02';
      *a = (long)a_local;
      *b = y_local;
    }
  }
  else if ((long)a_local < 0) {
    *index = '\x01';
    *a = -y_local;
    *b = -z_local;
  }
  else {
    *index = '\0';
    *a = y_local;
    *b = z_local;
  }
  return;
}

Assistant:

inline void SphereToCube(const T x, const T y, const T z, 
                             T & a, T & b, char & index)
    {
        T ax = absolute(x);
        T ay = absolute(y);
        T az = absolute(z);
        if (az >= ax && az >= ay)
        {
            if (z >= (T)(0))
            {
                index = 0;
                a = x;
                b = y;
            }
            else
            {
                index = 1;
                a = -x;
                b = -y;
            }
        }
        else if (ay >= ax && ay >= az)
        {
            if (y >= (T)(0))
            {
                index = 2;
                a = z;
                b = x;
            }
            else
            {
                index = 3;
                a = -z;
                b = -x;
            }
        }
        else if (ax >= ay && ax >= az)
        {
            if (x >= (T)(0))
            {
                index = 4;
                a = y;
                b = z;
            }
            else
            {
                index = 5;
                a = -y;
                b = -z;
            }
        }
    }